

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu2_v2.c
# Opt level: O0

MPP_RET hal_h264e_vepu2_init_v2(void *hal,MppEncHalCfg *cfg)

{
  MPP_RET local_24;
  MPP_RET ret;
  HalH264eVepu2Ctx *p;
  MppEncHalCfg *cfg_local;
  void *hal_local;
  
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu2_v2","enter %p\n","hal_h264e_vepu2_init_v2",hal);
  }
  *(MppEncCfgSet **)hal = cfg->cfg;
  cfg->type = VPU_CLIENT_VEPU2;
  local_24 = mpp_dev_init(&cfg->dev,cfg->type);
  if (local_24 == MPP_OK) {
    *(MppDev *)((long)hal + 8) = cfg->dev;
    local_24 = h264e_vepu_buf_init((HalH264eVepuBufs *)((long)hal + 0x18));
    if (local_24 == MPP_OK) {
      local_24 = h264e_vepu_mbrc_init
                           ((HalH264eVepuMbRcCtx *)((long)hal + 0x2f8),
                            (HalH264eVepuMbRc *)((long)hal + 0x198));
      if (local_24 == MPP_OK) {
        h264e_vepu_stream_amend_init((HalH264eVepuStreamAmend *)((long)hal + 0x298));
      }
      else {
        _mpp_log_l(2,"hal_h264e_vepu2_v2","init mb rate control failed ret: %d\n",
                   "hal_h264e_vepu2_init_v2",(ulong)(uint)local_24);
      }
    }
    else {
      _mpp_log_l(2,"hal_h264e_vepu2_v2","init vepu buffer failed ret: %d\n",
                 "hal_h264e_vepu2_init_v2",(ulong)(uint)local_24);
    }
  }
  else {
    _mpp_log_l(2,"hal_h264e_vepu2_v2","mpp_dev_init failed ret: %d\n","hal_h264e_vepu2_init_v2",
               (ulong)(uint)local_24);
  }
  if (local_24 != MPP_OK) {
    hal_h264e_vepu2_deinit_v2(hal);
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu2_v2","leave %p\n","hal_h264e_vepu2_init_v2",hal);
  }
  return local_24;
}

Assistant:

static MPP_RET hal_h264e_vepu2_init_v2(void *hal, MppEncHalCfg *cfg)
{
    HalH264eVepu2Ctx *p = (HalH264eVepu2Ctx *)hal;
    MPP_RET ret = MPP_OK;

    hal_h264e_dbg_func("enter %p\n", p);

    p->cfg = cfg->cfg;

    /* update output to MppEnc */
    cfg->type = VPU_CLIENT_VEPU2;

    ret = mpp_dev_init(&cfg->dev, cfg->type);
    if (ret) {
        mpp_err_f("mpp_dev_init failed ret: %d\n", ret);
        goto DONE;
    }
    p->dev = cfg->dev;

    ret = h264e_vepu_buf_init(&p->hw_bufs);
    if (ret) {
        mpp_err_f("init vepu buffer failed ret: %d\n", ret);
        goto DONE;
    }

    ret = h264e_vepu_mbrc_init(&p->rc_ctx, &p->hw_mbrc);
    if (ret) {
        mpp_err_f("init mb rate control failed ret: %d\n", ret);
        goto DONE;
    }

    /* create buffer to TSVC stream */
    h264e_vepu_stream_amend_init(&p->amend);

DONE:
    if (ret)
        hal_h264e_vepu2_deinit_v2(hal);

    hal_h264e_dbg_func("leave %p\n", p);
    return ret;
}